

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void charaff_from_obj_index(OBJ_INDEX_DATA *obj,AFFECT_DATA *paf)

{
  string_view fmt;
  string_view fmt_00;
  CLogger *in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  AFFECT_DATA *prev;
  char *in_stack_ffffffffffffffd8;
  undefined8 *puVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    fmt._M_str = unaff_retaddr;
    fmt._M_len = in_RDI;
    CLogger::Warn<>(in_RSI,fmt);
  }
  else {
    if (in_RSI == *(CLogger **)(in_RDI + 0x18)) {
      *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)in_RSI;
    }
    else {
      for (puVar1 = *(undefined8 **)(in_RDI + 0x18); puVar1 != (undefined8 *)0x0;
          puVar1 = (undefined8 *)*puVar1) {
        if ((CLogger *)*puVar1 == in_RSI) {
          *puVar1 = *(undefined8 *)in_RSI;
          break;
        }
      }
      if (puVar1 == (undefined8 *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffe0,(char *)0x0);
        fmt_00._M_str = unaff_retaddr;
        fmt_00._M_len = in_RDI;
        CLogger::Warn<>(in_RSI,fmt_00);
        return;
      }
    }
    free_affect((AFFECT_DATA *)0x600b59);
  }
  return;
}

Assistant:

void charaff_from_obj_index(OBJ_INDEX_DATA *obj, AFFECT_DATA *paf)
{
	if (obj->charaffs == nullptr)
	{
		RS.Logger.Warn("charaff_from_obj_index: no affect.");
		return;
	}

	if (paf == obj->charaffs)
	{
		obj->charaffs = paf->next;
	}
	else
	{
		AFFECT_DATA *prev;
		for (prev = obj->charaffs; prev != nullptr; prev = prev->next)
		{
			if (prev->next == paf)
			{
				prev->next = paf->next;
				break;
			}
		}

		if (prev == nullptr)
		{
			RS.Logger.Warn("charaff_from_obj_index: cannot find paf.");
			return;
		}
	}

	free_affect(paf);
}